

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O3

SocketLinux *
rcdiscover::SocketLinux::create
          (SocketLinux *__return_storage_ptr__,in_addr_t dst_ip,uint16_t port,string *iface_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  local_30._M_dataplus._M_p = (iface_name->_M_dataplus)._M_p;
  paVar1 = &iface_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&iface_name->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = iface_name->_M_string_length;
  (iface_name->_M_dataplus)._M_p = (pointer)paVar1;
  iface_name->_M_string_length = 0;
  (iface_name->field_2)._M_local_buf[0] = '\0';
  SocketLinux(__return_storage_ptr__,2,2,0x11,dst_ip,port,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SocketLinux SocketLinux::create(const in_addr_t dst_ip, const uint16_t port,
                                std::string iface_name)
{
  return SocketLinux(AF_INET, SOCK_DGRAM, IPPROTO_UDP, dst_ip, port,
                     std::move(iface_name));
}